

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.hpp
# Opt level: O2

size_t __thiscall
jessilib::find<char32_t,false>
          (jessilib *this,basic_string_view<char32_t,_std::char_traits<char32_t>_> in_string,
          char32_t in_codepoint)

{
  int iVar1;
  int iVar2;
  jessilib *pjVar3;
  jessilib *pjVar4;
  
  pjVar3 = (jessilib *)0xffffffffffffffff;
  if (this != (jessilib *)0x0) {
    iVar1 = jessilib::fold((wchar32)in_string._M_str);
    pjVar4 = (jessilib *)0x0;
    while ((pjVar3 = (jessilib *)0xffffffffffffffff, this != pjVar4 &&
           (iVar2 = jessilib::fold(*(wchar32 *)(in_string._M_len + (long)pjVar4 * 4)),
           pjVar3 = pjVar4, iVar2 != iVar1))) {
      pjVar4 = pjVar4 + 1;
    }
  }
  return (size_t)pjVar3;
}

Assistant:

size_t find(std::basic_string_view<LhsCharT> in_string, char32_t in_codepoint) {
	// If we don't have anything to search through, there's nothing to be found
	if (in_string.empty()) {
		return decltype(in_string)::npos;
	}

	if constexpr (!CaseSensitive) {
		in_codepoint = fold(in_codepoint);
	}

	size_t codepoints_removed{};
	while (!in_string.empty()) {
		std::basic_string_view<LhsCharT> string = in_string;
		decode_result string_front = decode_codepoint(string);

		if (string_front.units == 0) {
			// Failed to decode front codepoint; bad unicode sequence
			return decltype(in_string)::npos;
		}

		if constexpr (CaseSensitive) {
			if (string_front.codepoint == in_codepoint) {
				// Match found!
				return codepoints_removed;
			}
		}
		else {
			if (fold(string_front.codepoint) == in_codepoint) {
				// Match found!
				return codepoints_removed;
			}
		}

		// Didn't find a match here; remove the front codepoint and try the next position
		in_string.remove_prefix(string_front.units);
		codepoints_removed += string_front.units;
	}

	// We reached the end of in_string before finding the prefix :(
	return decltype(in_string)::npos;
}